

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line_test.cpp
# Opt level: O1

void license::test::create_project
               (path *projects_folder,path *expectedPrivateKey,path *expected_public_key,
               path *mock_source_folder,string *project_name)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long *plVar3;
  undefined1 **ppuVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int result;
  string mock_source;
  string projects_str;
  char *argv1 [9];
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 **local_240;
  ulong local_238;
  undefined1 *local_230;
  int **ppiStack_228;
  undefined1 local_220 [8];
  undefined8 local_218;
  shared_count sStack_210;
  int local_204;
  shared_count *local_200;
  undefined8 local_1f8;
  shared_count asStack_1f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  undefined1 local_1d8 [16];
  undefined1 *local_1c8;
  char *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  string *local_1b0;
  path *local_1a8;
  undefined4 local_19c;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined4 *local_178;
  int *local_170;
  undefined **local_168;
  char *local_160;
  char *local_158;
  undefined1 ***local_150;
  pointer local_148;
  char *local_140;
  undefined1 *local_138;
  char *local_130;
  shared_count *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_1b0 = project_name;
  local_1a8 = mock_source_folder;
  boost::filesystem::detail::remove_all(projects_folder,(error_code *)0x0);
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x21);
  boost::filesystem::detail::status((detail *)&local_168,expectedPrivateKey,(error_code *)0x0);
  local_200 = (shared_count *)CONCAT71(local_200._1_7_,(uint)local_168 < 2);
  local_1f8 = 0;
  asStack_1f0[0].pi_ = (sp_counted_base *)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 "Private key ",&expectedPrivateKey->m_pathname);
  local_1b8 = &expectedPrivateKey->m_pathname;
  plVar3 = (long *)std::__cxx11::string::append(local_260);
  ppuVar4 = (undefined1 **)(plVar3 + 2);
  if ((undefined1 **)*plVar3 == ppuVar4) {
    local_230 = *ppuVar4;
    ppiStack_228 = (int **)plVar3[3];
    local_240 = &local_230;
  }
  else {
    local_230 = *ppuVar4;
    local_240 = (undefined1 **)*plVar3;
  }
  local_238 = plVar3[1];
  local_150 = &local_240;
  *plVar3 = (long)ppuVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_160 = (char *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = &PTR__lazy_ostream_005c4460;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion(&local_200,&local_168,&local_70,0x21,1,1,0);
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  local_1e0 = &expected_public_key->m_pathname;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_);
  }
  boost::detail::shared_count::~shared_count(asStack_1f0);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x23);
  pbVar2 = local_1e0;
  boost::filesystem::detail::status((detail *)&local_168,(path *)local_1e0,(error_code *)0x0);
  local_200 = (shared_count *)CONCAT71(local_200._1_7_,(uint)local_168 < 2);
  local_1f8 = 0;
  asStack_1f0[0].pi_ = (sp_counted_base *)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 "Public key ",pbVar2);
  plVar3 = (long *)std::__cxx11::string::append(local_260);
  ppuVar4 = (undefined1 **)(plVar3 + 2);
  if ((undefined1 **)*plVar3 == ppuVar4) {
    local_230 = *ppuVar4;
    ppiStack_228 = (int **)plVar3[3];
    local_240 = &local_230;
  }
  else {
    local_230 = *ppuVar4;
    local_240 = (undefined1 **)*plVar3;
  }
  local_238 = plVar3[1];
  *plVar3 = (long)ppuVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_160 = (char *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = &PTR__lazy_ostream_005c4460;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_240;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::report_assertion(&local_200,&local_168,&local_a0,0x23,1,1,0);
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_);
  }
  boost::detail::shared_count::~shared_count(asStack_1f0);
  pcVar1 = (local_1a8->m_pathname)._M_dataplus._M_p;
  local_200 = asStack_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar1,pcVar1 + (local_1a8->m_pathname)._M_string_length);
  pcVar1 = (projects_folder->m_pathname)._M_dataplus._M_p;
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,pcVar1,pcVar1 + (projects_folder->m_pathname)._M_string_length);
  local_168 = (undefined **)0x483213;
  local_160 = "project";
  local_158 = "init";
  local_150 = (undefined1 ***)0x483366;
  local_148 = (local_1b0->_M_dataplus)._M_p;
  local_140 = "--projects-folder";
  local_138 = local_198[0];
  local_130 = "--templates";
  local_128 = local_200;
  local_204 = CommandLineParser::parseCommandLine(9,(char **)&local_168);
  pbVar2 = local_1b8;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x32);
  local_1d8[8] = 0;
  local_1d8._0_8_ = &PTR__lazy_ostream_005c44d8;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_170 = &local_204;
  local_220[0] = local_204 == 0;
  local_178 = &local_19c;
  local_19c = 0;
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_38 = "";
  ppiStack_228 = &local_170;
  local_238 = local_238 & 0xffffffffffffff00;
  local_240 = &PTR__lazy_ostream_005c4518;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_250._8_8_ = &local_178;
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_005c4518;
  local_250._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_210);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x33);
  boost::filesystem::detail::status((detail *)&local_240,(path *)pbVar2,(error_code *)0x0);
  local_220[0] = 1 < (uint)local_240;
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "Private key ",pbVar2);
  plVar3 = (long *)std::__cxx11::string::append(local_1d8);
  local_260._0_8_ = &local_250;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar5) {
    local_250._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_250._8_8_ = plVar3[3];
  }
  else {
    local_250._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_260._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar3;
  }
  local_260._8_8_ = plVar3[1];
  *plVar3 = (long)paVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_238 = local_238 & 0xffffffffffffff00;
  local_240 = &PTR__lazy_ostream_005c4460;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_e8 = "";
  ppiStack_228 = (int **)local_260;
  boost::test_tools::tt_detail::report_assertion(local_220,&local_240,&local_f0,0x33,2,1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_);
  }
  if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
    operator_delete((void *)local_1d8._0_8_);
  }
  boost::detail::shared_count::~shared_count(&sStack_210);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x34);
  pbVar2 = local_1e0;
  boost::filesystem::detail::status((detail *)&local_240,(path *)local_1e0,(error_code *)0x0);
  local_220[0] = 1 < (uint)local_240;
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "Public key ",pbVar2);
  plVar3 = (long *)std::__cxx11::string::append(local_1d8);
  local_260._0_8_ = &local_250;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar5) {
    local_250._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_250._8_8_ = plVar3[3];
  }
  else {
    local_250._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_260._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar3;
  }
  local_260._8_8_ = plVar3[1];
  *plVar3 = (long)paVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_238 = local_238 & 0xffffffffffffff00;
  local_240 = &PTR__lazy_ostream_005c4460;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_118 = "";
  ppiStack_228 = (int **)local_260;
  boost::test_tools::tt_detail::report_assertion(local_220,&local_240,&local_120,0x34,1,1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_);
  }
  if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
    operator_delete((void *)local_1d8._0_8_);
  }
  boost::detail::shared_count::~shared_count(&sStack_210);
  if (local_198[0] != local_188) {
    operator_delete(local_198[0]);
  }
  if (local_200 != asStack_1f0) {
    operator_delete(local_200);
  }
  return;
}

Assistant:

static void create_project(const fs::path& projects_folder, const fs::path& expectedPrivateKey,
						   const fs::path& expected_public_key, const fs::path& mock_source_folder,
						   const string& project_name) {
	fs::remove_all(projects_folder);
	BOOST_CHECK_MESSAGE(!fs::exists(expectedPrivateKey),
						"Private key " + expectedPrivateKey.string() + " can't be deleted.");
	BOOST_CHECK_MESSAGE(!fs::exists(expected_public_key),
						"Public key " + expected_public_key.string() + " can't be deleted.");
	const string mock_source = mock_source_folder.string();
	const string projects_str = projects_folder.string();
	int argc = 9;
	const char* argv1[] = {"lcc",
						   "project",
						   "init",
						   "-n",
						   project_name.c_str(),
						   "--projects-folder",
						   projects_str.c_str(),
						   "--templates",
						   mock_source.c_str()};
	// initialize_project
	int result = CommandLineParser::parseCommandLine(argc, argv1);
	BOOST_CHECK_EQUAL(result, 0);
	BOOST_REQUIRE_MESSAGE(fs::exists(expectedPrivateKey), "Private key " + expectedPrivateKey.string() + " created.");
	BOOST_CHECK_MESSAGE(fs::exists(expected_public_key), "Public key " + expected_public_key.string() + " created.");
}